

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O0

char * Fantasy_Rapunzel_parse_json_struct
                 (flatcc_json_parser_t *ctx,char *buf,char *end,flatcc_builder_ref_t *result)

{
  flatcc_builder_ref_t fVar1;
  void *struct_base;
  char *pcVar2;
  void *pval;
  flatcc_builder_ref_t *result_local;
  char *end_local;
  char *buf_local;
  flatcc_json_parser_t *ctx_local;
  
  *result = 0;
  struct_base = flatcc_builder_start_struct(ctx->ctx,8,4);
  end_local = buf;
  if ((struct_base != (void *)0x0) &&
     (end_local = Fantasy_Rapunzel_parse_json_struct_inline(ctx,buf,end,struct_base),
     ctx->error == 0)) {
    fVar1 = flatcc_builder_end_struct(ctx->ctx);
    *result = fVar1;
    if (fVar1 != 0) {
      return end_local;
    }
  }
  pcVar2 = flatcc_json_parser_set_error(ctx,end_local,end,0x23);
  return pcVar2;
}

Assistant:

static const char *Fantasy_Rapunzel_parse_json_struct(flatcc_json_parser_t *ctx, const char *buf, const char *end, flatcc_builder_ref_t *result)
{
    void *pval;

    *result = 0;
    if (!(pval = flatcc_builder_start_struct(ctx->ctx, 8, 4))) goto failed;
    buf = Fantasy_Rapunzel_parse_json_struct_inline(ctx, buf, end, pval);
    if (ctx->error || !(*result = flatcc_builder_end_struct(ctx->ctx))) goto failed;
    return buf;
failed:
    return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);
}